

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileStore.h
# Opt level: O3

void __thiscall FIX::FileStoreFactory::FileStoreFactory(FileStoreFactory *this,string *path)

{
  pointer pcVar1;
  
  *(code **)this = std::logic_error::logic_error;
  *(FileStoreFactory **)(this + 8) = this + 0x18;
  pcVar1 = (path->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)(this + 8),pcVar1,pcVar1 + path->_M_string_length);
  *(undefined4 *)(this + 0x30) = 0;
  *(undefined8 *)(this + 0x38) = 0;
  *(FileStoreFactory **)(this + 0x40) = this + 0x30;
  *(FileStoreFactory **)(this + 0x48) = this + 0x30;
  *(undefined8 *)(this + 0x50) = 0;
  *(undefined ***)(this + 0x58) = &PTR__Dictionary_0015fd60;
  *(undefined4 *)(this + 0x68) = 0;
  *(undefined8 *)(this + 0x70) = 0;
  *(FileStoreFactory **)(this + 0x78) = this + 0x68;
  *(FileStoreFactory **)(this + 0x80) = this + 0x68;
  *(undefined8 *)(this + 0x88) = 0;
  *(FileStoreFactory **)(this + 0x90) = this + 0xa0;
  *(undefined8 *)(this + 0x98) = 0;
  this[0xa0] = (FileStoreFactory)0x0;
  this[0xb0] = (FileStoreFactory)0x0;
  return;
}

Assistant:

FileStoreFactory( const std::string& path )
: m_path( path ) {}